

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  uVar2 = 6;
  if (nVars < 6) {
    uVar2 = nVars;
  }
  memset(pStore,0,(long)nVars << 3);
  uVar3 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      if (0 < nVars) {
        uVar8 = pTruth[uVar6];
        lVar7 = 0;
        do {
          uVar9 = *(ulong *)((long)Truth6 + lVar7) & uVar8;
          uVar9 = (uVar9 >> 1 & 0x5555555555555555) + (uVar9 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar9 = (uVar9 >> 4 & 0x707070707070707) + (uVar9 & 0x707070707070707);
          uVar9 = (uVar9 >> 8 & 0xf000f000f000f) + (uVar9 & 0xf000f000f000f);
          lVar10 = (uVar9 >> 0x10 & 0x1f0000001f) + (uVar9 & 0x1f0000001f);
          piVar1 = (int *)((long)pStore + lVar7 + 4);
          *piVar1 = *piVar1 + (int)((ulong)lVar10 >> 0x20) + (int)lVar10;
          lVar7 = lVar7 + 8;
        } while ((ulong)uVar2 << 3 != lVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  if (0 < (int)uVar4 && 6 < nVars) {
    uVar6 = 0;
    do {
      lVar7 = 0;
      do {
        if (((uint)uVar6 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          uVar8 = (pTruth[uVar6] >> 1 & 0x5555555555555555) + (pTruth[uVar6] & 0x5555555555555555);
          uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
          uVar8 = (uVar8 >> 4 & 0x707070707070707) + (uVar8 & 0x707070707070707);
          uVar8 = (uVar8 >> 8 & 0xf000f000f000f) + (uVar8 & 0xf000f000f000f);
          lVar10 = (uVar8 >> 0x10 & 0x1f0000001f) + (uVar8 & 0x1f0000001f);
          pStore[lVar7 * 2 + 0xd] =
               pStore[lVar7 * 2 + 0xd] + (int)((ulong)lVar10 >> 0x20) + (int)lVar10;
        }
        lVar7 = lVar7 + 1;
      } while ((ulong)(uint)nVars - 6 != lVar7);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  if ((int)uVar4 < 1) {
    iVar5 = 0;
  }
  else {
    uVar6 = 0;
    iVar5 = 0;
    do {
      uVar8 = (pTruth[uVar6] >> 1 & 0x5555555555555555) + (pTruth[uVar6] & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar8 = (uVar8 >> 4 & 0x707070707070707) + (uVar8 & 0x707070707070707);
      uVar8 = (uVar8 >> 8 & 0xf000f000f000f) + (uVar8 & 0xf000f000f000f);
      lVar7 = (uVar8 >> 0x10 & 0x1f0000001f) + (uVar8 & 0x1f0000001f);
      iVar5 = (int)lVar7 + iVar5 + (int)((ulong)lVar7 >> 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if (0 < nVars) {
    uVar3 = 0;
    do {
      pStore[uVar3 * 2] = iVar5 - pStore[uVar3 * 2 + 1];
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
  }
  return;
}

Assistant:

void If_CluCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    int nWords = If_CluWordNum( nVars );
    int i, k, nOnes = 0, Limit = Abc_MinInt( nVars, 6 );
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    // compute positive cofactors
    for ( k = 0; k < nWords; k++ )
        for ( i = 0; i < Limit; i++ )
            pStore[2*i+1] += If_CluCountOnes( pTruth[k] & Truth6[i] );
    if ( nVars > 6 )
    for ( k = 0; k < nWords; k++ )
        for ( i = 6; i < nVars; i++ )
            if ( k & (1 << (i-6)) )
                pStore[2*i+1] += If_CluCountOnes( pTruth[k] );
    // compute negative cofactors
    for ( k = 0; k < nWords; k++ )
        nOnes += If_CluCountOnes( pTruth[k] );
    for ( i = 0; i < nVars; i++ )
        pStore[2*i] = nOnes - pStore[2*i+1];
}